

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaCom.c
# Opt level: O1

int Cba_CommandTest(Abc_Frame_t *pAbc,int argc,char **argv)

{
  void *pvVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  
  pvVar1 = pAbc->pAbcCba;
  bVar2 = false;
  Extra_UtilGetoptReset();
  while( true ) {
    iVar3 = Extra_UtilGetopt(argc,argv,"vh");
    if (iVar3 != 0x76) break;
    bVar2 = (bool)(bVar2 ^ 1);
  }
  if (iVar3 == -1) {
    iVar3 = 0;
    if (pvVar1 == (void *)0x0) {
      iVar3 = 0;
      Abc_Print(1,"Cba_CommandTest(): There is no current design.\n");
    }
  }
  else {
    Abc_Print(-2,"usage: :test [-vh]\n");
    Abc_Print(-2,"\t         experiments with word-level networks\n");
    pcVar4 = "yes";
    if (!bVar2) {
      pcVar4 = "no";
    }
    Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar4);
    Abc_Print(-2,"\t-h     : print the command usage\n");
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

int Cba_CommandTest( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Cba_Man_t * p = Cba_AbcGetMan(pAbc);
    int c, fVerbose  = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "vh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( p == NULL )
    {
        Abc_Print( 1, "Cba_CommandTest(): There is no current design.\n" );
        return 0;
    }
    return 0;
usage:
    Abc_Print( -2, "usage: :test [-vh]\n" );
    Abc_Print( -2, "\t         experiments with word-level networks\n" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}